

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::ConcatArgs<unsigned_int>
               (RecyclableObject *pDestObj,TypeId *remoteTypeIds,Arguments *args,
               ScriptContext *scriptContext,uint start,uint startIdxDest,
               ConcatSpreadableState previousItemSpreadableState,BigIndex *firstPromotedItemLength)

{
  code *pcVar1;
  bool bVar2;
  uint index;
  uint32 uVar3;
  BOOL BVar4;
  int succeeded;
  uint uVar5;
  JavascriptArray *arr;
  Var pvVar6;
  JavascriptArray *pJVar7;
  RecyclableObject *instance;
  uint64 uVar8;
  char *pcVar9;
  undefined4 in_register_00000084;
  uint64 uVar10;
  undefined4 in_register_0000008c;
  uint32 idxSubItem;
  uint32 index_00;
  uint start_00;
  BigIndex BVar11;
  BigIndex index_01;
  PropertyRecord *local_c8;
  PropertyRecord *propertyRecord;
  TypeId *local_b8;
  Arguments *local_b0;
  ScriptContext *local_a8;
  undefined4 *local_a0;
  RecyclableObject *local_98;
  undefined1 auStack_90 [8];
  BigIndex idxSubItem_1;
  undefined1 auStack_78 [8];
  BigIndex length;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  
  jsReentLock._28_4_ = in_register_0000008c;
  jsReentLock._24_4_ = startIdxDest;
  uVar10 = CONCAT44(in_register_00000084,start);
  local_58 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_58)->noJsReentrancy;
  ((ThreadContext *)local_58)->noJsReentrancy = true;
  local_98 = pDestObj;
  arr = TryVarToNonES5Array(pDestObj);
  if (arr != (JavascriptArray *)0x0) {
    EnsureNonNativeArray(arr);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_58,arr);
  }
  local_b8 = remoteTypeIds;
  local_b0 = args;
  if (((scriptContext->config).threadConfig)->m_ES6IsConcatSpreadable == true) {
    local_a0 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_a8 = scriptContext;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    local_a0 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_a0 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xcb4,
                                "(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled())",
                                "scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()");
    if (!bVar2) {
LAB_00a57dfc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *local_a0 = 0;
    local_a8 = scriptContext;
  }
  do {
    pcVar9 = "攀⸀";
    if ((*(uint *)&local_b0->Info & 0xffffff) <= start) {
      uVar3 = jsReentLock._24_4_;
      if (arr == (JavascriptArray *)0x0) {
        *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pvVar6 = JavascriptNumber::ToVar(uVar3,scriptContext);
        (*(local_98->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x17])(local_98,0xd1,pvVar6,0,0);
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
LAB_00a57dc3:
        *(bool *)((long)local_58 + 0x108) = true;
      }
      else if ((arr->super_ArrayObject).length != uVar3) {
        SetLength(arr,uVar3);
      }
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      return;
    }
    idxSubItem_1.bigIndex._4_4_ = start;
    pvVar6 = Arguments::operator[](local_b0,start);
    JsReentLock::setObjectForMutation((JsReentLock *)local_58,pvVar6);
    if (previousItemSpreadableState == ConcatSpreadableState_NotChecked) {
      pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),jsReentLock.m_arrayObject2._0_1_);
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar4 = JavascriptOperators::IsConcatSpreadable(pvVar6);
      start_00 = idxSubItem_1.bigIndex._4_4_;
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      *(bool *)((long)local_58 + 0x108) = true;
      if (BVar4 == 0) goto LAB_00a578ca;
LAB_00a57800:
      if (((arr == (JavascriptArray *)0x0) || (bVar2 = IsDirectAccessArray(pvVar6), !bVar2)) ||
         (bVar2 = IsDirectAccessArray(arr), !bVar2)) {
LAB_00a57855:
        bVar2 = VarIs<Js::RecyclableObject>(pvVar6);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_a0 = 1;
          pcVar9 = "VarIs<RecyclableObject>(aItem)";
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0xce8,"(VarIs<RecyclableObject>(aItem))",
                                      "VarIs<RecyclableObject>(aItem)");
          if (!bVar2) goto LAB_00a57dfc;
          *local_a0 = 0;
        }
        BigIndex::BigIndex((BigIndex *)auStack_78,0);
        uVar3 = (uint32)pcVar9;
        if (firstPromotedItemLength == (BigIndex *)0x0) {
          uVar3 = (uint32)CONCAT71((int7)((ulong)pcVar9 >> 8),jsReentLock.m_arrayObject2._0_1_);
          *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          uVar8 = OP_GetLength(pvVar6,scriptContext);
          BigIndex::BigIndex((BigIndex *)auStack_90,uVar8);
          auStack_78 = (undefined1  [8])CONCAT44(auStack_90._4_4_,auStack_90._0_4_);
          length.index = idxSubItem_1.index;
          length._4_4_ = idxSubItem_1._4_4_;
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          *(bool *)((long)local_58 + 0x108) = true;
        }
        else {
          auStack_78 = *(undefined1 (*) [8])firstPromotedItemLength;
          length._0_8_ = firstPromotedItemLength->bigIndex;
        }
        BVar11.bigIndex = jsReentLock._24_8_;
        BVar11.index = length.index;
        BVar11._4_4_ = length._4_4_;
        bVar2 = PromoteToBigIndex((JavascriptArray *)((ulong)auStack_78 & 0xffffffff),BVar11,uVar3);
        if (bVar2) {
          *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          ConcatArgs<Js::JavascriptArray::BigIndex>
                    (local_98,local_b8,local_b0,scriptContext,start_00,jsReentLock._24_4_,
                     ConcatSpreadableState_CheckedAndTrue,(BigIndex *)auStack_78);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          goto LAB_00a57dc3;
        }
        BVar11 = BigIndex::operator+((BigIndex *)auStack_78,jsReentLock._24_4_);
        idxSubItem_1._0_8_ = BVar11.bigIndex;
        auStack_90._0_4_ = BVar11.index;
        BigIndex::BigIndex((BigIndex *)&stack0xffffffffffffff38,0x1fffffffffffff);
        bVar2 = BigIndex::operator>((BigIndex *)auStack_90,(BigIndex *)&stack0xffffffffffffff38);
        if (bVar2) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec09,(PCWSTR)0x0);
        }
        instance = VarTo<Js::RecyclableObject>(pvVar6);
        uVar3 = 0xffffffff;
        if (auStack_78._0_4_ != 0xffffffff) {
          uVar3 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
        }
        for (index_00 = 0; index = jsReentLock._24_4_ + index_00, uVar3 != index_00;
            index_00 = index_00 + 1) {
          *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BVar4 = JavascriptOperators::HasItem(instance,index_00);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          *(bool *)((long)local_58 + 0x108) = true;
          if (BVar4 != 0) {
            *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            pvVar6 = JavascriptOperators::GetItem(instance,index_00,local_a8);
            JsReentLock::MutateArrayObject((JsReentLock *)local_58);
            *(bool *)((long)local_58 + 0x108) = true;
            if (arr == (JavascriptArray *)0x0) {
              *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              succeeded = (*(local_98->super_FinalizableObject).super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject[0x29])(local_98,(ulong)index,pvVar6,4);
              ThrowErrorOnFailure(succeeded,local_a8,index);
              JsReentLock::MutateArrayObject((JsReentLock *)local_58);
              *(bool *)((long)local_58 + 0x108) = true;
            }
            else {
              GenericDirectSetItemAt(arr,index,pvVar6);
            }
          }
        }
        BigIndex::BigIndex((BigIndex *)auStack_90,0xffffffff);
        start_00 = idxSubItem_1.bigIndex._4_4_;
        scriptContext = local_a8;
        while (bVar2 = BigIndex::operator<((BigIndex *)auStack_90,(BigIndex *)auStack_78), bVar2) {
          uVar8 = BigIndex::GetBigIndex((BigIndex *)auStack_90);
          JavascriptOperators::GetPropertyIdForInt(uVar8,scriptContext,&stack0xffffffffffffff38);
          *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BVar4 = JavascriptOperators::HasProperty(instance,local_c8->pid);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          *(bool *)((long)local_58 + 0x108) = true;
          if (BVar4 != 0) {
            *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            pvVar6 = JavascriptOperators::GetProperty
                               (instance,local_c8->pid,scriptContext,(PropertyValueInfo *)0x0);
            JsReentLock::MutateArrayObject((JsReentLock *)local_58);
            *(bool *)((long)local_58 + 0x108) = true;
            if (arr == (JavascriptArray *)0x0) {
              *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              uVar5 = (*(local_98->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[0x29])(local_98,(ulong)index,pvVar6,4);
              index_01.bigIndex = uVar10;
              index_01.index = idxSubItem_1.index;
              index_01._4_4_ = idxSubItem_1._4_4_;
              ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar5,(BOOL)scriptContext,
                                  (ScriptContext *)(ulong)(uint)auStack_90._0_4_,index_01);
              JsReentLock::MutateArrayObject((JsReentLock *)local_58);
              *(bool *)((long)local_58 + 0x108) = true;
            }
            else {
              GenericDirectSetItemAt(arr,index,pvVar6);
            }
          }
          if (auStack_90._0_4_ == 0xffffffff) {
            idxSubItem_1._0_8_ = idxSubItem_1._0_8_ + 1;
          }
          else {
            auStack_90._0_4_ = auStack_90._0_4_ + 1;
          }
          index = index + 1;
        }
      }
      else {
        pJVar7 = UnsafeVarTo<Js::JavascriptArray>(pvVar6);
        BigIndex::BigIndex((BigIndex *)auStack_78,
                           (pJVar7->super_ArrayObject).length + jsReentLock._24_4_);
        if (auStack_78._0_4_ == 0xffffffff) goto LAB_00a57855;
        pJVar7 = UnsafeVarTo<Js::JavascriptArray>(pvVar6);
        bVar2 = IsFillFromPrototypes(pJVar7);
        if (bVar2) goto LAB_00a57855;
        bVar2 = VarIs<Js::JavascriptNativeIntArray>(pvVar6);
        if ((bVar2) &&
           (pJVar7 = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeIntArray>(pvVar6),
           pJVar7 != (JavascriptArray *)0x0)) {
          *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          BigIndex::BigIndex((BigIndex *)auStack_78,jsReentLock._24_4_);
          uVar3 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
          uVar10 = 0xffffffffffffffff;
          CopyNativeIntArrayElementsToVar(arr,uVar3,(JavascriptNativeIntArray *)pJVar7,0,0xffffffff)
          ;
        }
        else {
          bVar2 = VarIs<Js::JavascriptNativeFloatArray>(pvVar6);
          if ((bVar2) &&
             (pJVar7 = (JavascriptArray *)UnsafeVarTo<Js::JavascriptNativeFloatArray>(pvVar6),
             pJVar7 != (JavascriptArray *)0x0)) {
            *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            BigIndex::BigIndex((BigIndex *)auStack_78,jsReentLock._24_4_);
            uVar3 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
            uVar10 = 0xffffffffffffffff;
            CopyNativeFloatArrayElementsToVar
                      (arr,uVar3,(JavascriptNativeFloatArray *)pJVar7,0,0xffffffff);
          }
          else {
            pJVar7 = UnsafeVarTo<Js::JavascriptArray>(pvVar6);
            *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            BigIndex::BigIndex((BigIndex *)auStack_78,jsReentLock._24_4_);
            uVar3 = BigIndex::GetSmallIndex((BigIndex *)auStack_78);
            uVar10 = 0xffffffffffffffff;
            CopyArrayElements(arr,uVar3,pJVar7,0,0xffffffff);
            JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          }
        }
        *(bool *)((long)local_58 + 0x108) = true;
        index = jsReentLock._24_4_ +
                (((JavascriptNativeArray *)&pJVar7->super_ArrayObject)->super_JavascriptArray).
                super_ArrayObject.length;
      }
      firstPromotedItemLength = (BigIndex *)0x0;
    }
    else {
      start_00 = idxSubItem_1.bigIndex._4_4_;
      if (previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue) goto LAB_00a57800;
LAB_00a578ca:
      *(undefined1 *)((long)local_58 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      uVar10 = jsReentLock._24_8_;
      SetConcatItem<unsigned_int>(pvVar6,start_00,arr,local_98,jsReentLock._24_4_,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)local_58);
      *(bool *)((long)local_58 + 0x108) = true;
      index = jsReentLock._24_4_ + 1;
    }
    start = start_00 + 1;
    previousItemSpreadableState = ConcatSpreadableState_NotChecked;
    jsReentLock._24_8_ = ZEXT48(index);
  } while( true );
}

Assistant:

void JavascriptArray::ConcatArgs(RecyclableObject* pDestObj, TypeId* remoteTypeIds,
        Js::Arguments& args, ScriptContext* scriptContext, uint start, uint startIdxDest,
        ConcatSpreadableState previousItemSpreadableState /*= ConcatSpreadableState_NotChecked*/, BigIndex *firstPromotedItemLength /* = nullptr */)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        JavascriptArray* pDestArray = JavascriptArray::TryVarToNonES5Array(pDestObj);
        if (pDestArray)
        {
            // ConcatArgs function expects to work on the Var array so we are ensuring it.
            pDestArray = EnsureNonNativeArray(pDestArray);
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pDestArray);
        }

        AssertOrFailFast(scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled()); // ConcatSpreadable is enabled already - not going back.

        T idxDest = startIdxDest;
        for (uint idxArg = start; idxArg < args.Info.Count; idxArg++)
        {
            Var aItem = args[idxArg];
            SETOBJECT_FOR_MUTATION(jsReentLock, aItem);

            bool spreadable = previousItemSpreadableState == ConcatSpreadableState_CheckedAndTrue;

            if (previousItemSpreadableState == ConcatSpreadableState_NotChecked)
            {
                JS_REENTRANT(jsReentLock, spreadable = !!JavascriptOperators::IsConcatSpreadable(aItem));
            }

            // Reset the state for the next item in the array
            previousItemSpreadableState = ConcatSpreadableState_NotChecked;

            if (!spreadable)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::SetConcatItem<T>(aItem, idxArg, pDestArray, pDestObj, idxDest, scriptContext));
                ++idxDest;
                continue;
            }

            if (pDestArray && JavascriptArray::IsDirectAccessArray(aItem) && JavascriptArray::IsDirectAccessArray(pDestArray)
                && BigIndex(idxDest + UnsafeVarTo<JavascriptArray>(aItem)->length).IsSmallIndex() && !UnsafeVarTo<JavascriptArray>(aItem)->IsFillFromPrototypes()) // Fast path
            {
                JavascriptNativeIntArray *pIntItemArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(aItem);
                if (pIntItemArray)
                {
                    JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeIntArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pIntItemArray));
                    idxDest = idxDest + pIntItemArray->length;
                }
                else
                {
                    JavascriptNativeFloatArray *pFloatItemArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(aItem);
                    if (pFloatItemArray)
                    {
                        JS_REENTRANT_NO_MUTATE(jsReentLock, CopyNativeFloatArrayElementsToVar(pDestArray, BigIndex(idxDest).GetSmallIndex(), pFloatItemArray));
                        idxDest = idxDest + pFloatItemArray->length;
                    }
                    else
                    {
                        JavascriptArray* pItemArray = UnsafeVarTo<JavascriptArray>(aItem);
                        JS_REENTRANT(jsReentLock, CopyArrayElements(pDestArray, BigIndex(idxDest).GetSmallIndex(), pItemArray));
                        idxDest = idxDest + pItemArray->length;
                    }
                }
            }
            else
            {
                AssertOrFailFast(VarIs<RecyclableObject>(aItem));

                //CONSIDER: enumerating remote array instead of walking all indices
                BigIndex length;
                if (firstPromotedItemLength != nullptr)
                {
                    length = *firstPromotedItemLength;
                }
                else
                {
                    JS_REENTRANT(jsReentLock, length = OP_GetLength(aItem, scriptContext));
                }

                if (PromoteToBigIndex(length, idxDest))
                {
                    // This is a special case for spreadable objects. We do not pre-calculate the length
                    // in EntryConcat like we do with Arrays because a getProperty on an object Length
                    // is observable. The result is we have to check for overflows separately for
                    // spreadable objects and promote to a bigger index type when we find them.
                    JS_REENTRANT(jsReentLock, ConcatArgs<BigIndex>(pDestObj, remoteTypeIds, args, scriptContext, idxArg, idxDest, ConcatSpreadableState_CheckedAndTrue, &length));
                    return;
                }

                if (length + idxDest > FiftyThirdPowerOfTwoMinusOne) // 2^53-1: from ECMA 22.1.3.1 Array.prototype.concat(...arguments)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_IllegalArraySizeAndLength);
                }

                RecyclableObject* itemObject = VarTo<RecyclableObject>(aItem);
                Var subItem;
                uint32 lengthToUin32Max = length.IsSmallIndex() ? length.GetSmallIndex() : MaxArrayLength;
                for (uint32 idxSubItem = 0u; idxSubItem < lengthToUin32Max; ++idxSubItem)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(itemObject, idxSubItem));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetItem(itemObject, idxSubItem, scriptContext));

                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxDest));
                        }
                    }
                    ++idxDest;
                }

                for (BigIndex idxSubItem = MaxArrayLength; idxSubItem < length; ++idxSubItem)
                {
                    PropertyRecord const * propertyRecord;
                    JavascriptOperators::GetPropertyIdForInt(idxSubItem.GetBigIndex(), scriptContext, &propertyRecord);
                    JS_REENTRANT(jsReentLock, BOOL hasProp = JavascriptOperators::HasProperty(itemObject, propertyRecord->GetPropertyId()));
                    if (hasProp)
                    {
                        JS_REENTRANT(jsReentLock, subItem = JavascriptOperators::GetProperty(itemObject, propertyRecord->GetPropertyId(), scriptContext));
                        if (pDestArray)
                        {
                            pDestArray->GenericDirectSetItemAt(idxDest, subItem);
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(SetArrayLikeObjects(pDestObj, idxDest, subItem), scriptContext, idxSubItem));
                        }
                    }
                    ++idxDest;
                }
            }

            firstPromotedItemLength = nullptr;
        }

        if (!pDestArray)
        {
            JS_REENTRANT(jsReentLock, pDestObj->SetProperty(PropertyIds::length, ConvertToIndex<T, Var>(idxDest, scriptContext), Js::PropertyOperation_None, nullptr));
        }
        else if (pDestArray->GetLength() != ConvertToIndex<T, uint32>(idxDest, scriptContext))
        {
            pDestArray->SetLength(ConvertToIndex<T, uint32>(idxDest, scriptContext));
        }
    }